

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O3

ScriptBuilder * __thiscall cfd::core::ScriptBuilder::AppendData(ScriptBuilder *this,Script *script)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> byte_datas;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40,
             &(script->script_data_).data_);
  ByteData::GetBytes(&local_28,(ByteData *)&local_40);
  if (local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  WallyUtil::CreateScriptDataFromBytes(&local_40,&local_28,0);
  ::std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)
             &this->script_byte_array_);
  if (local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return this;
}

Assistant:

ScriptBuilder& ScriptBuilder::AppendData(const Script& script) {
  const std::vector<uint8_t>& byte_array = script.GetData().GetBytes();
  std::vector<uint8_t> byte_datas =
      WallyUtil::CreateScriptDataFromBytes(byte_array);
  std::copy(
      byte_datas.begin(), byte_datas.end(),
      std::back_inserter(script_byte_array_));
  return *this;
}